

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O0

REF_STATUS ref_histogram_gather_stat(REF_HISTOGRAM ref_histogram,REF_MPI ref_mpi)

{
  void *output;
  int local_30;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT observations;
  REF_INT i;
  REF_DBL *stats;
  REF_MPI ref_mpi_local;
  REF_HISTOGRAM ref_histogram_local;
  
  if (ref_histogram->nstat < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
           0x14c,"ref_histogram_gather_stat","malloc stats of REF_DBL negative");
    ref_histogram_local._4_4_ = 1;
  }
  else {
    output = malloc((long)ref_histogram->nstat << 3);
    if (output == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",
             0x14c,"ref_histogram_gather_stat","malloc stats of REF_DBL NULL");
      ref_histogram_local._4_4_ = 2;
    }
    else {
      ref_histogram_local._4_4_ =
           ref_mpi_sum(ref_mpi,ref_histogram->stats,output,ref_histogram->nstat,3);
      if (ref_histogram_local._4_4_ == 0) {
        if (ref_mpi->id == 0) {
          local_30 = 0;
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_histogram->nbin;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            local_30 = ref_histogram->bins[ref_private_macro_code_rss] + local_30;
          }
          if (0 < local_30) {
            for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_histogram->nstat;
                ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
              ref_histogram->stats[ref_private_macro_code_rss] =
                   *(double *)((long)output + (long)ref_private_macro_code_rss * 8) /
                   (double)local_30;
            }
          }
        }
        else {
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_histogram->nstat;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            ref_histogram->stats[ref_private_macro_code_rss] = 0.0;
          }
        }
        if (output != (void *)0x0) {
          free(output);
        }
        ref_histogram_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,0x150,"ref_histogram_gather_stat",(ulong)ref_histogram_local._4_4_,"sum");
      }
    }
  }
  return ref_histogram_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_gather_stat(REF_HISTOGRAM ref_histogram,
                                             REF_MPI ref_mpi) {
  REF_DBL *stats;
  REF_INT i, observations;

  ref_malloc(stats, ref_histogram_nstat(ref_histogram), REF_DBL);

  RSS(ref_mpi_sum(ref_mpi, ref_histogram->stats, stats,
                  ref_histogram_nstat(ref_histogram), REF_DBL_TYPE),
      "sum");

  if (ref_mpi_once(ref_mpi)) {
    observations = 0;
    for (i = 0; i < ref_histogram_nbin(ref_histogram); i++)
      observations += ref_histogram->bins[i];
    if (observations > 0)
      for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
        ref_histogram_stat(ref_histogram, i) = stats[i] / (REF_DBL)observations;
  } else {
    for (i = 0; i < ref_histogram_nstat(ref_histogram); i++)
      ref_histogram_stat(ref_histogram, i) = 0.0;
  }

  ref_free(stats);

  return REF_SUCCESS;
}